

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

int quicly_local_cid_set_size(quicly_local_cid_set_t *set,size_t size)

{
  undefined8 uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  en_quicly_local_cid_state_t eVar9;
  undefined4 uVar10;
  en_quicly_local_cid_state_t eVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  int iVar14;
  quicly_local_cid_t *pqVar15;
  quicly_local_cid_t *pqVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  quicly_local_cid_t *pqVar21;
  size_t idx;
  int iVar23;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  auVar13 = _DAT_0012c8f0;
  auVar8 = _DAT_0012c8e0;
  auVar7 = _DAT_0012c8d0;
  if (4 < size) {
    __assert_fail("size <= PTLS_ELEMENTSOF(set->cids)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x6a,"int quicly_local_cid_set_size(quicly_local_cid_set_t *, size_t)");
  }
  uVar20 = set->_size;
  lVar18 = size - uVar20;
  if (size < uVar20) {
    __assert_fail("set->_size <= size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x6b,"int quicly_local_cid_set_size(quicly_local_cid_set_t *, size_t)");
  }
  if (size >= uVar20 && lVar18 != 0) {
    lVar19 = lVar18 + -1;
    auVar22._8_4_ = (int)lVar19;
    auVar22._0_8_ = lVar19;
    auVar22._12_4_ = (int)((ulong)lVar19 >> 0x20);
    pqVar16 = set->cids + uVar20 + 3;
    uVar20 = 0;
    auVar22 = auVar22 ^ _DAT_0012c8f0;
    do {
      auVar24._8_4_ = (int)uVar20;
      auVar24._0_8_ = uVar20;
      auVar24._12_4_ = (int)(uVar20 >> 0x20);
      auVar25 = (auVar24 | auVar8) ^ auVar13;
      iVar23 = auVar22._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar23 && auVar22._0_4_ < auVar25._0_4_ ||
                  iVar23 < auVar25._4_4_) & 1)) {
        pqVar16[-3].state = 0;
      }
      if ((auVar25._12_4_ != auVar22._12_4_ || auVar25._8_4_ <= auVar22._8_4_) &&
          auVar25._12_4_ <= auVar22._12_4_) {
        pqVar16[-2].state = 0;
      }
      auVar24 = (auVar24 | auVar7) ^ auVar13;
      iVar14 = auVar24._4_4_;
      if (iVar14 <= iVar23 && (iVar14 != iVar23 || auVar24._0_4_ <= auVar22._0_4_)) {
        pqVar16[-1].state = 0;
        pqVar16->state = QUICLY_LOCAL_CID_STATE_IDLE;
      }
      uVar20 = uVar20 + 4;
      pqVar16 = pqVar16 + 4;
    } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar20);
  }
  set->_size = size;
  if (size == 0) {
    iVar23 = 0;
  }
  else {
    pqVar16 = set->cids;
    idx = 0;
    iVar23 = 0;
    do {
      if (pqVar16[idx].state == QUICLY_LOCAL_CID_STATE_IDLE) {
        iVar14 = generate_cid(set,idx);
        if (iVar14 == 0) {
          return iVar23;
        }
        pqVar21 = pqVar16 + idx;
        pqVar21->state = QUICLY_LOCAL_CID_STATE_PENDING;
        iVar23 = 1;
        pqVar15 = pqVar16;
        for (sVar17 = idx; sVar17 != 0; sVar17 = sVar17 - 1) {
          if (pqVar15->state != QUICLY_LOCAL_CID_STATE_PENDING) {
            uVar1 = *(undefined8 *)(pqVar15->stateless_reset_token + 0xb);
            eVar11 = pqVar15->state;
            uVar12 = *(undefined4 *)&pqVar15->field_0x4;
            uVar2 = pqVar15->sequence;
            auVar7 = *(undefined1 (*) [16])(pqVar15->cid).cid;
            auVar8 = *(undefined1 (*) [16])((pqVar15->cid).cid + 0x10);
            *(undefined8 *)(pqVar15->stateless_reset_token + 0xb) =
                 *(undefined8 *)(pqVar21->stateless_reset_token + 0xb);
            eVar9 = pqVar21->state;
            uVar10 = *(undefined4 *)&pqVar21->field_0x4;
            uVar3 = pqVar21->sequence;
            uVar4 = *(undefined8 *)(pqVar21->cid).cid;
            uVar5 = *(undefined8 *)((pqVar21->cid).cid + 8);
            uVar6 = *(undefined8 *)(pqVar21->stateless_reset_token + 3);
            *(undefined8 *)((pqVar15->cid).cid + 0x10) = *(undefined8 *)((pqVar21->cid).cid + 0x10);
            *(undefined8 *)(pqVar15->stateless_reset_token + 3) = uVar6;
            *(undefined8 *)(pqVar15->cid).cid = uVar4;
            *(undefined8 *)((pqVar15->cid).cid + 8) = uVar5;
            pqVar15->state = eVar9;
            *(undefined4 *)&pqVar15->field_0x4 = uVar10;
            pqVar15->sequence = uVar3;
            *(undefined8 *)(pqVar21->stateless_reset_token + 0xb) = uVar1;
            *(undefined1 (*) [16])((pqVar21->cid).cid + 0x10) = auVar8;
            *(undefined1 (*) [16])(pqVar21->cid).cid = auVar7;
            pqVar21->state = eVar11;
            *(undefined4 *)&pqVar21->field_0x4 = uVar12;
            pqVar21->sequence = uVar2;
            break;
          }
          pqVar15 = pqVar15 + 1;
        }
      }
      idx = idx + 1;
    } while (idx != size);
  }
  return iVar23;
}

Assistant:

int quicly_local_cid_set_size(quicly_local_cid_set_t *set, size_t size)
{
    int is_pending = 0;

    assert(size <= PTLS_ELEMENTSOF(set->cids));
    assert(set->_size <= size);

    for (size_t i = set->_size; i < size; i++)
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_IDLE;

    set->_size = size;

    /* First we prepare N CIDs (to be precise here we prepare N-1, as we already had one upon initialization).
     * Later, every time one of the CIDs is retired, we immediately prepare one additional CID
     * to always fill the CID list. */
    for (size_t i = 0; i < size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_IDLE)
            continue;

        if (!generate_cid(set, i))
            break;
        do_mark_pending(set, i);
        is_pending = 1;
    }

    return is_pending;
}